

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_doctype_ignore(xml_parser *this,char_t *s)

{
  bool bVar1;
  char_t *local_20;
  char_t *s_local;
  xml_parser *this_local;
  
  bVar1 = false;
  if ((*s == '<') && (bVar1 = false, s[1] == '!')) {
    bVar1 = s[2] == '[';
  }
  if (bVar1) {
    local_20 = s + 1;
    while( true ) {
      while( true ) {
        if (*local_20 == '\0') {
          this->error_offset = local_20;
          this->error_status = status_bad_doctype;
          return (char_t *)0x0;
        }
        if (((*local_20 != '<') || (local_20[1] != '!')) || (local_20[2] != '[')) break;
        local_20 = parse_doctype_ignore(this,local_20);
        if (local_20 == (char_t *)0x0) {
          return (char_t *)0x0;
        }
      }
      if (((*local_20 == ']') && (local_20[1] == ']')) && (local_20[2] == '>')) break;
      local_20 = local_20 + 1;
    }
    return local_20 + 3;
  }
  __assert_fail("s[0] == \'<\' && s[1] == \'!\' && s[2] == \'[\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                ,0x841,
                "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_ignore(char_t *)"
               );
}

Assistant:

char_t* parse_doctype_ignore(char_t* s)
		{
			assert(s[0] == '<' && s[1] == '!' && s[2] == '[');
			s++;

			while (*s)
			{
				if (s[0] == '<' && s[1] == '!' && s[2] == '[')
				{
					// nested ignore section
					s = parse_doctype_ignore(s);
					if (!s) return s;
				}
				else if (s[0] == ']' && s[1] == ']' && s[2] == '>')
				{
					// ignore section end
					s += 3;

					return s;
				}
				else s++;
			}

			PUGI__THROW_ERROR(status_bad_doctype, s);
		}